

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O2

Aig_Man_t * Abc_NtkToDarChoices(Abc_Ntk_t *pNtk)

{
  anon_union_8_4_617c9805_for_Abc_Obj_t__17 aVar1;
  Vec_Int_t *pVVar2;
  int iVar3;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  char *pcVar4;
  Aig_Obj_t **ppAVar5;
  Abc_Obj_t *pAVar6;
  Abc_Obj_t *pAVar7;
  Abc_Obj_t *p1;
  void *pvVar8;
  int i;
  Aig_Man_t *pAVar9;
  
  i = 0;
  p = Abc_AigDfs(pNtk,0,0);
  p_00 = Aig_ManStart(pNtk->nObjCounts[7] + 100);
  iVar3 = pNtk->nBarBufs;
  p_00->nConstrs = pNtk->nConstrs;
  p_00->nBarBufs = iVar3;
  pcVar4 = Extra_UtilStrsav(pNtk->pName);
  p_00->pName = pcVar4;
  pcVar4 = Extra_UtilStrsav(pNtk->pSpec);
  p_00->pSpec = pcVar4;
  iVar3 = Abc_NtkGetChoiceNum(pNtk);
  if (iVar3 != 0) {
    ppAVar5 = (Aig_Obj_t **)calloc(1,(long)pNtk->nObjs << 3);
    p_00->pEquivs = ppAVar5;
  }
  aVar1 = (anon_union_8_4_617c9805_for_Abc_Obj_t__17)p_00->pConst1;
  pAVar6 = Abc_AigConst1(pNtk);
  pAVar6->field_6 = aVar1;
  for (; i < pNtk->vCis->nSize; i = i + 1) {
    pAVar6 = Abc_NtkCi(pNtk,i);
    pAVar7 = (Abc_Obj_t *)Aig_ObjCreateCi(p_00);
    (pAVar6->field_6).pCopy = pAVar7;
  }
  iVar3 = 0;
  while( true ) {
    if (p->nSize <= iVar3) {
      Vec_PtrFree(p);
      for (iVar3 = 0; iVar3 < pNtk->vCos->nSize; iVar3 = iVar3 + 1) {
        pAVar6 = Abc_NtkCo(pNtk,iVar3);
        pAVar6 = Abc_ObjChild0Copy(pAVar6);
        Aig_ObjCreateCo(p_00,(Aig_Obj_t *)pAVar6);
      }
      Aig_ManSetRegNum(p_00,0);
      pAVar9 = p_00;
      iVar3 = Aig_ManCheck(p_00);
      if (iVar3 == 0) {
        Abc_Print((int)pAVar9,"Abc_NtkToDar: AIG check has failed.\n");
        Aig_ManStop(p_00);
        p_00 = (Aig_Man_t *)0x0;
      }
      return p_00;
    }
    pAVar7 = (Abc_Obj_t *)Vec_PtrEntry(p,iVar3);
    pAVar6 = Abc_ObjChild0Copy(pAVar7);
    p1 = Abc_ObjChild1Copy(pAVar7);
    pAVar6 = (Abc_Obj_t *)Aig_And(p_00,(Aig_Obj_t *)pAVar6,(Aig_Obj_t *)p1);
    (pAVar7->field_6).pCopy = pAVar6;
    if (((ulong)pAVar7 & 1) != 0) break;
    if (pAVar7->pNtk->ntkType != ABC_NTK_STRASH) {
      pcVar4 = "Abc_NtkIsStrash(pNode->pNtk)";
      goto LAB_0022c7f8;
    }
    pvVar8 = (pAVar7->field_5).pData;
    if ((pvVar8 != (void *)0x0) && (0 < (pAVar7->vFanouts).nSize)) {
      for (; pvVar8 != (void *)0x0; pvVar8 = *(void **)((long)pvVar8 + 0x38)) {
        if (p_00->pEquivs == (Aig_Obj_t **)0x0) {
          __assert_fail("p->pEquivs",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aig.h"
                        ,0x149,"void Aig_ObjSetEquiv(Aig_Man_t *, Aig_Obj_t *, Aig_Obj_t *)");
        }
        pVVar2 = &pAVar6->vFanins;
        pAVar6 = *(Abc_Obj_t **)((long)pvVar8 + 0x40);
        p_00->pEquivs[*(int *)((long)&pVVar2->pArray + 4)] = (Aig_Obj_t *)pAVar6;
      }
    }
    iVar3 = iVar3 + 1;
  }
  pcVar4 = "!Abc_ObjIsComplement(pNode)";
LAB_0022c7f8:
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abc.h"
                ,399,"int Abc_AigNodeIsChoice(Abc_Obj_t *)");
}

Assistant:

Aig_Man_t * Abc_NtkToDarChoices( Abc_Ntk_t * pNtk )
{
    Aig_Man_t * pMan;
    Abc_Obj_t * pObj, * pPrev, * pFanin;
    Vec_Ptr_t * vNodes;
    int i;
    vNodes = Abc_AigDfs( pNtk, 0, 0 );
    // create the manager
    pMan = Aig_ManStart( Abc_NtkNodeNum(pNtk) + 100 );
    pMan->nConstrs = pNtk->nConstrs;
    pMan->nBarBufs = pNtk->nBarBufs;
    pMan->pName = Extra_UtilStrsav( pNtk->pName );
    pMan->pSpec = Extra_UtilStrsav( pNtk->pSpec );
    if ( Abc_NtkGetChoiceNum(pNtk) )
    {
        pMan->pEquivs = ABC_ALLOC( Aig_Obj_t *, Abc_NtkObjNum(pNtk) );
        memset( pMan->pEquivs, 0, sizeof(Aig_Obj_t *) * Abc_NtkObjNum(pNtk) );
    }
    // transfer the pointers to the basic nodes
    Abc_AigConst1(pNtk)->pCopy = (Abc_Obj_t *)Aig_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pCopy = (Abc_Obj_t *)Aig_ObjCreateCi(pMan);
    // perform the conversion of the internal nodes (assumes DFS ordering)
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pObj, i )
    {
        pObj->pCopy = (Abc_Obj_t *)Aig_And( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj), (Aig_Obj_t *)Abc_ObjChild1Copy(pObj) );
//        Abc_Print( 1, "%d->%d ", pObj->Id, ((Aig_Obj_t *)pObj->pCopy)->Id );
        if ( Abc_AigNodeIsChoice( pObj ) )
        {
            for ( pPrev = pObj, pFanin = (Abc_Obj_t *)pObj->pData; pFanin; pPrev = pFanin, pFanin = (Abc_Obj_t *)pFanin->pData )
                Aig_ObjSetEquiv( pMan, (Aig_Obj_t *)pPrev->pCopy, (Aig_Obj_t *)pFanin->pCopy );
//            Aig_ManCreateChoice( pIfMan, (Aig_Obj_t *)pNode->pCopy );
        }
    }
    Vec_PtrFree( vNodes );
    // create the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Aig_ObjCreateCo( pMan, (Aig_Obj_t *)Abc_ObjChild0Copy(pObj) );
    // complement the 1-valued registers
    Aig_ManSetRegNum( pMan, 0 );
    if ( !Aig_ManCheck( pMan ) )
    {
        Abc_Print( 1, "Abc_NtkToDar: AIG check has failed.\n" );
        Aig_ManStop( pMan );
        return NULL;
    }
    return pMan;
}